

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O3

void __thiscall kratos::FSM::realize(FSM *this)

{
  pointer *pppFVar1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  pointer pcVar5;
  FSM *name;
  FSM *pFVar6;
  element_type *peVar7;
  element_type *peVar8;
  bool bVar9;
  pointer ppFVar10;
  pointer ppFVar11;
  long lVar12;
  long *plVar13;
  pointer ppFVar14;
  Enum *this_00;
  iterator iVar15;
  EnumVar *current_state;
  EnumVar *next_state;
  UserException *pUVar16;
  uint32_t width;
  FSM **fsm;
  size_type *psVar17;
  _Alloc_hider _Var18;
  ulong uVar19;
  byte bVar20;
  Generator *pGVar21;
  element_type *peVar22;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  __buckets_ptr pp_Var23;
  undefined8 *puVar24;
  __node_base_ptr p_Var25;
  double dVar26;
  undefined1 auVar27 [16];
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  undefined1 local_1e0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  raw_def;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1a8;
  undefined1 local_1a0 [8];
  unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  state_name_mapping;
  vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> states;
  shared_ptr<kratos::SequentialStmtBlock> seq;
  IfStmt *local_128;
  shared_ptr<kratos::IfStmt> seq_if;
  undefined1 local_110 [16];
  undefined1 local_100 [8];
  string next_state_name;
  undefined1 auStack_c8 [8];
  string current_state_name;
  __node_base_ptr ap_Stack_98 [2];
  undefined1 auStack_88 [8];
  shared_ptr<kratos::Var> predicate;
  shared_ptr<kratos::AssignStmt> stmt;
  undefined4 uStack_58;
  undefined4 uStack_54;
  vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_> fsms;
  
  if (this->realized_ != false) {
    return;
  }
  get_all_child_states
            ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)
             &state_name_mapping._M_h._M_single_bucket,this,false);
  lVar12 = (long)states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                 _M_impl.super__Vector_impl_data._M_start -
           (long)state_name_mapping._M_h._M_single_bucket;
  if (lVar12 == 0) {
    pUVar16 = (UserException *)__cxa_allocate_exception(0x10);
    auStack_c8 = (undefined1  [8])(this->fsm_name_)._M_dataplus._M_p;
    current_state_name._M_dataplus._M_p = (pointer)(this->fsm_name_)._M_string_length;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)auStack_c8;
    format_str_00.size_ = 0xd;
    format_str_00.data_ = (char *)0x10;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_1a0,(detail *)"FSM {0} is empty",format_str_00,args_00);
    UserException::UserException(pUVar16,(string *)local_1a0);
    __cxa_throw(pUVar16,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  auVar27._8_4_ = (int)(lVar12 >> 0x23);
  auVar27._0_8_ = lVar12 >> 3;
  auVar27._12_4_ = 0x45300000;
  dVar26 = log2((auVar27._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)(lVar12 >> 3)) - 4503599627370496.0));
  dVar26 = ceil(dVar26);
  ppFVar10 = states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  p_Var25 = state_name_mapping._M_h._M_single_bucket;
  width = 1;
  if (1 < (uint)(long)dVar26) {
    width = (uint)(long)dVar26;
  }
  raw_def._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&raw_def;
  raw_def._M_t._M_impl._0_4_ = 0;
  raw_def._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  raw_def._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  raw_def._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  raw_def._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       raw_def._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if ((this->start_state_).super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    pUVar16 = (UserException *)__cxa_allocate_exception(0x10);
    auStack_c8 = (undefined1  [8])(this->fsm_name_)._M_dataplus._M_p;
    current_state_name._M_dataplus._M_p = (pointer)(this->fsm_name_)._M_string_length;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)auStack_c8;
    format_str_01.size_ = 0xd;
    format_str_01.data_ = (char *)0x22;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_1a0,(detail *)"FSM {0} doesn\'t have a start state",format_str_01,
               args_01);
    UserException::UserException(pUVar16,(string *)local_1a0);
    __cxa_throw(pUVar16,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1a0 = (undefined1  [8])&state_name_mapping._M_h._M_rehash_policy._M_next_resize;
  state_name_mapping._M_h._M_buckets = (__buckets_ptr)0x1;
  state_name_mapping._M_h._M_bucket_count = 0;
  state_name_mapping._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  state_name_mapping._M_h._M_element_count._0_4_ = 0x3f800000;
  state_name_mapping._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  state_name_mapping._M_h._M_rehash_policy._4_4_ = 0;
  state_name_mapping._M_h._M_rehash_policy._M_next_resize = 0;
  if (state_name_mapping._M_h._M_single_bucket !=
      (__node_base_ptr)
      states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (this->child_fsms_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    lVar12 = 0;
    pp_Var23 = (__buckets_ptr)0x0;
    do {
      auStack_c8 = (undefined1  [8])&current_state_name._M_string_length;
      current_state_name._M_dataplus._M_p = (pointer)0x0;
      current_state_name._M_string_length = current_state_name._M_string_length & 0xffffffffffffff00
      ;
      if (seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::__cxx11::string::_M_assign((string *)auStack_c8);
      }
      else {
        p_Var3 = p_Var25[(long)pp_Var23]._M_nxt[6]._M_nxt;
        _uStack_58 = (char *)&fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
        p_Var4 = p_Var3->_M_nxt;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&stack0xffffffffffffffa8,p_Var4,
                   (long)&p_Var4->_M_nxt + (long)&(p_Var3[1]._M_nxt)->_M_nxt);
        std::__cxx11::string::append((char *)&stack0xffffffffffffffa8);
        plVar13 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&stack0xffffffffffffffa8,
                                     (ulong)p_Var25[(long)pp_Var23]._M_nxt[2]._M_nxt);
        psVar17 = (size_type *)(plVar13 + 2);
        if ((size_type *)*plVar13 == psVar17) {
          next_state_name._M_string_length = *psVar17;
          next_state_name.field_2._M_allocated_capacity = plVar13[3];
          local_100 = (undefined1  [8])&next_state_name._M_string_length;
        }
        else {
          next_state_name._M_string_length = *psVar17;
          local_100 = (undefined1  [8])*plVar13;
        }
        next_state_name._M_dataplus._M_p = (pointer)plVar13[1];
        *plVar13 = (long)psVar17;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        std::__cxx11::string::operator=((string *)auStack_c8,(string *)local_100);
        if (local_100 != (undefined1  [8])&next_state_name._M_string_length) {
          operator_delete((void *)local_100,next_state_name._M_string_length + 1);
        }
        if ((pointer *)_uStack_58 !=
            &fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
             super__Vector_impl_data._M_finish) {
          operator_delete(_uStack_58,
                          (long)fsms.
                                super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 1);
        }
      }
      local_100 = (undefined1  [8])pp_Var23;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
      ::_M_emplace_unique<std::__cxx11::string&,unsigned_long>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                  *)local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_c8,
                 (unsigned_long *)local_100);
      std::
      _Hashtable<kratos::FSMState*,std::pair<kratos::FSMState*const,std::__cxx11::string>,std::allocator<std::pair<kratos::FSMState*const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<kratos::FSMState*>,std::hash<kratos::FSMState*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<kratos::FSMState*const&,std::__cxx11::string&>
                ((_Hashtable<kratos::FSMState*,std::pair<kratos::FSMState*const,std::__cxx11::string>,std::allocator<std::pair<kratos::FSMState*const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<kratos::FSMState*>,std::hash<kratos::FSMState*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_1a0,(long)&p_Var25->_M_nxt + lVar12,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_c8);
      FSMState::check_outputs((FSMState *)p_Var25[(long)pp_Var23]._M_nxt);
      if (auStack_c8 != (undefined1  [8])&current_state_name._M_string_length) {
        operator_delete((void *)auStack_c8,current_state_name._M_string_length + 1);
      }
      ppFVar14 = (pointer)((long)&p_Var25[1]._M_nxt + lVar12);
      lVar12 = lVar12 + 8;
      pp_Var23 = (__buckets_ptr)((long)pp_Var23 + 1);
    } while (ppFVar14 != ppFVar10);
  }
  pGVar21 = this->generator_;
  pcVar5 = (this->fsm_name_)._M_dataplus._M_p;
  auStack_c8 = (undefined1  [8])&current_state_name._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)auStack_c8,pcVar5,pcVar5 + (this->fsm_name_)._M_string_length);
  std::__cxx11::string::append(auStack_c8);
  this_00 = Generator::enum_(pGVar21,(string *)auStack_c8,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                              *)local_1e0,width);
  if (auStack_c8 != (undefined1  [8])&current_state_name._M_string_length) {
    operator_delete((void *)auStack_c8,current_state_name._M_string_length + 1);
  }
  pGVar21 = this->generator_;
  if (pGVar21->debug == true) {
    auStack_c8 = (undefined1  [8])ap_Stack_98;
    current_state_name._M_dataplus._M_p = (pointer)0x1;
    current_state_name._M_string_length = 0;
    current_state_name.field_2._M_allocated_capacity = 0;
    current_state_name.field_2._8_4_ = 0x3f800000;
    ap_Stack_98[0] = (__node_base_ptr)0x0;
    seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    if (state_name_mapping._M_h._M_single_bucket !=
        (__node_base_ptr)
        states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pppFVar1 = &fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      p_Var25 = state_name_mapping._M_h._M_single_bucket;
      do {
        name = ((key_type)p_Var25->_M_nxt)->parent_;
        if (*(long **)((long)auStack_c8 +
                      ((ulong)name % (ulong)current_state_name._M_dataplus._M_p) * 8) != (long *)0x0
           ) {
          plVar13 = (long *)**(long **)((long)auStack_c8 +
                                       ((ulong)name % (ulong)current_state_name._M_dataplus._M_p) *
                                       8);
          pFVar6 = (FSM *)plVar13[1];
          do {
            if (name == pFVar6) goto LAB_00398357;
            plVar13 = (long *)*plVar13;
          } while ((plVar13 != (long *)0x0) &&
                  (pFVar6 = (FSM *)plVar13[1],
                  (ulong)pFVar6 % (ulong)current_state_name._M_dataplus._M_p ==
                  (ulong)name % (ulong)current_state_name._M_dataplus._M_p));
        }
        local_100 = (undefined1  [8])0x0;
        next_state_name._M_dataplus._M_p = (pointer)(name->fn_name_ln_)._M_h._M_bucket_count;
        next_state_name._M_string_length = 0;
        next_state_name.field_2._M_allocated_capacity = (name->fn_name_ln_)._M_h._M_element_count;
        next_state_name.field_2._8_8_ = *(undefined8 *)&(name->fn_name_ln_)._M_h._M_rehash_policy;
        _uStack_58 = (char *)local_100;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::__cxx11::string,unsigned_int>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::__cxx11::string,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::__cxx11::string,unsigned_int>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::__cxx11::string,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::pair<std::__cxx11::string,unsigned_int>>,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::__cxx11::string,unsigned_int>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::__cxx11::string,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)local_100,&(name->fn_name_ln_)._M_h,
                   (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_true>_>_>
                    *)&stack0xffffffffffffffa8);
        for (puVar24 = (undefined8 *)next_state_name._M_string_length; puVar24 != (undefined8 *)0x0;
            puVar24 = (undefined8 *)*puVar24) {
          get_state((FSM *)&stack0xffffffffffffffa8,&name->fsm_name_);
          _Var18._M_p = _uStack_58;
          if (fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>.
                       _M_impl.super__Vector_impl_data._M_start);
          }
          iVar15 = std::
                   _Hashtable<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find((_Hashtable<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)local_1a0,(key_type *)p_Var25);
          if (iVar15.
              super__Node_iterator_base<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            pUVar16 = (UserException *)__cxa_allocate_exception(0x10);
            _uStack_58 = *(char **)(_Var18._M_p + 0x10);
            fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
            super__Vector_impl_data._M_start = *(pointer *)(_Var18._M_p + 0x18);
            fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)(this->fsm_name_)._M_dataplus._M_p;
            fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)(this->fsm_name_)._M_string_length;
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.args_ = in_R9.args_;
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)&stack0xffffffffffffffa8;
            format_str.size_ = 0xdd;
            format_str.data_ = (char *)0x47;
            fmt::v7::detail::vformat_abi_cxx11_
                      ((string *)
                       &states.
                        super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (detail *)
                       "Unable to find state name {0} from FSM {1}. Is it a disconnected state?",
                       format_str,args);
            UserException::UserException
                      (pUVar16,(string *)
                               &states.
                                super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            __cxa_throw(pUVar16,&UserException::typeinfo,std::runtime_error::~runtime_error);
          }
          iVar15 = std::
                   _Hashtable<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find((_Hashtable<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)local_1a0,(key_type *)p_Var25);
          if (iVar15.
              super__Node_iterator_base<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            std::__throw_out_of_range("_Map_base::at");
          }
          _uStack_58 = (char *)pppFVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&stack0xffffffffffffffa8,
                     *(long *)((long)iVar15.
                                     super__Node_iterator_base<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                     ._M_cur + 0x10),
                     *(long *)((long)iVar15.
                                     super__Node_iterator_base<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                     ._M_cur + 0x18) +
                     *(long *)((long)iVar15.
                                     super__Node_iterator_base<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                     ._M_cur + 0x10));
          Enum::add_debug_info
                    (this_00,(string *)&stack0xffffffffffffffa8,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                      *)(puVar24 + 5));
          if ((pointer *)_uStack_58 != pppFVar1) {
            operator_delete(_uStack_58,
                            (long)fsms.
                                  super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish + 1);
          }
        }
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_100);
LAB_00398357:
        p_Var25 = p_Var25 + 1;
      } while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var25 !=
               seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    }
    std::
    _Hashtable<const_kratos::FSM_*,_const_kratos::FSM_*,_std::allocator<const_kratos::FSM_*>,_std::__detail::_Identity,_std::equal_to<const_kratos::FSM_*>,_std::hash<const_kratos::FSM_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<const_kratos::FSM_*,_const_kratos::FSM_*,_std::allocator<const_kratos::FSM_*>,_std::__detail::_Identity,_std::equal_to<const_kratos::FSM_*>,_std::hash<const_kratos::FSM_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)auStack_c8);
    pGVar21 = this->generator_;
  }
  local_100 = (undefined1  [8])&next_state_name._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"current_state","");
  Generator::get_unique_variable_name
            ((string *)auStack_c8,pGVar21,&this->fsm_name_,(string *)local_100);
  if (local_100 != (undefined1  [8])&next_state_name._M_string_length) {
    operator_delete((void *)local_100,next_state_name._M_string_length + 1);
  }
  pGVar21 = this->generator_;
  pppFVar1 = &fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  _uStack_58 = (char *)pppFVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffffa8,"next_state","");
  Generator::get_unique_variable_name
            ((string *)local_100,pGVar21,&this->fsm_name_,(string *)&stack0xffffffffffffffa8);
  if ((pointer *)_uStack_58 != pppFVar1) {
    operator_delete(_uStack_58,
                    (long)fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish + 1);
  }
  pGVar21 = this->generator_;
  std::__shared_ptr<kratos::Enum,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Enum,void>
            ((__shared_ptr<kratos::Enum,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffa8,
             (__weak_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2> *)this_00);
  current_state =
       Generator::enum_var(pGVar21,(string *)auStack_c8,
                           (shared_ptr<kratos::Enum> *)&stack0xffffffffffffffa8);
  if (fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  this->current_state_ = current_state;
  pGVar21 = this->generator_;
  std::__shared_ptr<kratos::Enum,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Enum,void>
            ((__shared_ptr<kratos::Enum,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffa8,
             (__weak_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2> *)this_00);
  next_state = Generator::enum_var(pGVar21,(string *)local_100,
                                   (shared_ptr<kratos::Enum> *)&stack0xffffffffffffffa8);
  if (fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  if (this->generator_->debug == true) {
    _uStack_58 = "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/fsm.cc";
    fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x95);
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)&(current_state->super_Var).super_IRNode.fn_name_ln,
               (pair<const_char_*,_int> *)&stack0xffffffffffffffa8);
    _uStack_58 = "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/fsm.cc";
    fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x96);
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)&(next_state->super_Var).super_IRNode.fn_name_ln,
               (pair<const_char_*,_int> *)&stack0xffffffffffffffa8);
  }
  Generator::sequential
            ((Generator *)
             &states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  _uStack_58 = (char *)((ulong)_uStack_58 & 0xffffffff00000000);
  fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(this->clk_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(this->clk_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
      super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
      super__Vector_impl_data._M_finish)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
           super__Vector_impl_data._M_finish)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
      super__Vector_impl_data._M_finish)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
           super__Vector_impl_data._M_finish)->_M_use_count + 1;
    }
  }
  SequentialStmtBlock::add_condition
            ((SequentialStmtBlock *)
             states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage,
             (pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)&stack0xffffffffffffffa8)
  ;
  if (fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  peVar22 = (this->reset_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar22->type_ == PortIO) {
    Var::as<kratos::Port>((Var *)&stack0xffffffffffffffa8);
    if ((_uStack_58[0x279] & 1U) == 0) {
      bVar20 = this->reset_high_;
    }
    else {
      Var::as<kratos::Port>((Var *)auStack_88);
      bVar20 = this->reset_high_ &
               *(byte *)&(((element_type *)((long)auStack_88 + 0x270))->super_IRNode).fn_name_ln.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
      if (predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
    }
    if (fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
    peVar22 = (this->reset_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((bVar20 & 1) == 0) {
      uStack_58 = 1;
      fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(this->reset_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
          super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
               super__Vector_impl_data._M_finish)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
               super__Vector_impl_data._M_finish)->_M_use_count + 1;
        }
      }
      fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)peVar22;
      SequentialStmtBlock::add_condition
                ((SequentialStmtBlock *)
                 states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)
                 &stack0xffffffffffffffa8);
      if (fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      }
      bVar9 = true;
      goto LAB_00398672;
    }
  }
  _uStack_58 = (char *)((ulong)_uStack_58 & 0xffffffff00000000);
  fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(this->reset_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
      super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
      super__Vector_impl_data._M_finish)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
           super__Vector_impl_data._M_finish)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
      super__Vector_impl_data._M_finish)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
           super__Vector_impl_data._M_finish)->_M_use_count + 1;
    }
  }
  fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)peVar22;
  SequentialStmtBlock::add_condition
            ((SequentialStmtBlock *)
             states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage,
             (pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)&stack0xffffffffffffffa8)
  ;
  if (fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  bVar9 = false;
LAB_00398672:
  if (this->generator_->debug == true) {
    _uStack_58 = "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/fsm.cc";
    fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0xab);
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)(states.
                   super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 1),
               (pair<const_char_*,_int> *)&stack0xffffffffffffffa8);
  }
  auStack_88 = (undefined1  [8])0x0;
  predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  if (bVar9) {
    Var::r_not((this->reset_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    Var::as<kratos::Var>((Var *)&stack0xffffffffffffffa8);
    ppFVar11 = fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    auStack_88 = (undefined1  [8])_uStack_58;
    peVar22 = predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    _uStack_58 = (char *)0x0;
    fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)ppFVar11;
    if ((peVar22 != (element_type *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar22),
       fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
       super__Vector_impl_data._M_start != (pointer)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
  }
  else {
    auStack_88 = (undefined1  [8])
                 (this->reset_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&predicate,
               &(this->reset_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<kratos::IfStmt>,std::shared_ptr<kratos::Var>&>
            ((__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2> *)&local_128,
             (allocator<kratos::IfStmt> *)&stack0xffffffffffffffa8,
             (shared_ptr<kratos::Var> *)auStack_88);
  peVar7 = (this->start_state_).super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  uVar19 = (ulong)peVar7 % (ulong)state_name_mapping._M_h._M_buckets;
  if (*(long **)((long)local_1a0 + uVar19 * 8) != (long *)0x0) {
    plVar13 = (long *)**(long **)((long)local_1a0 + uVar19 * 8);
    peVar8 = (element_type *)plVar13[1];
    do {
      if (peVar7 == peVar8) {
        _uStack_58 = (char *)pppFVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&stack0xffffffffffffffa8,plVar13[2],plVar13[3] + plVar13[2]);
        Enum::get_enum((Enum *)&raw_def._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)this_00);
        local_110._0_8_ = raw_def._M_t._M_impl.super__Rb_tree_header._M_node_count;
        local_110._8_8_ = p_Stack_1a8;
        raw_def._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        Var::assign((Var *)&predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(shared_ptr<kratos::Var> *)current_state,
                    (AssignmentType)local_110);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_);
        }
        local_110._0_8_ =
             predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        local_110._8_8_ =
             stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            pvVar2 = &((stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
            *(int *)&(pvVar2->
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&(pvVar2->
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1;
            UNLOCK();
          }
          else {
            pvVar2 = &((stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
            *(int *)&(pvVar2->
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&(pvVar2->
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        IfStmt::add_then_stmt(local_128,(shared_ptr<kratos::Stmt> *)local_110);
        if ((element_type *)local_110._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_);
        }
        if (this->generator_->debug == true) {
          if ((this->start_state_debug_).first._M_string_length != 0) {
            std::
            vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
            ::emplace_back<std::pair<std::__cxx11::string,unsigned_int>&>
                      ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                        *)&(predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count,&this->start_state_debug_);
          }
          local_110._0_8_ =
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/fsm.cc";
          local_110._8_4_ = 0xbf;
          std::
          vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
          ::emplace_back<std::pair<char_const*,int>>
                    ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                      *)&(predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count,(pair<const_char_*,_int> *)local_110);
        }
        if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
        }
        if ((pointer *)_uStack_58 != pppFVar1) {
          operator_delete(_uStack_58,
                          (long)fsms.
                                super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 1);
        }
        std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                  ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
                   &predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,
                   (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                   &(next_state->super_Var).super_enable_shared_from_this<kratos::Var>);
        Var::assign((Var *)&stack0xffffffffffffffa8,(shared_ptr<kratos::Var> *)current_state,
                    (int)&predicate + 8);
        if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
        }
        if (this->generator_->debug == true) {
          predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)anon_var_dwarf_133c6d5;
          std::
          vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
          ::emplace_back<std::pair<char_const*,int>>
                    ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                      *)(_uStack_58 + 8),
                     (pair<const_char_*,_int> *)
                     &predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        ppFVar11 = fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_uStack_58;
        if (fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
                     super__Vector_impl_data._M_start + 1) =
                 *(int *)(fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>.
                          _M_impl.super__Vector_impl_data._M_start + 1) + 1;
            UNLOCK();
          }
          else {
            *(int *)(fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
                     super__Vector_impl_data._M_start + 1) =
                 *(int *)(fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>.
                          _M_impl.super__Vector_impl_data._M_start + 1) + 1;
          }
        }
        IfStmt::add_else_stmt
                  (local_128,
                   (shared_ptr<kratos::Stmt> *)
                   &predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (ppFVar11 != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppFVar11);
        }
        if (fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
                     super__Vector_impl_data._M_start);
        }
        _uStack_58 = (char *)local_128;
        fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            pvVar2 = &((seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       )->super_Stmt).super_IRNode.fn_name_ln;
            *(int *)&(pvVar2->
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&(pvVar2->
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1;
            UNLOCK();
          }
          else {
            pvVar2 = &((seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       )->super_Stmt).super_IRNode.fn_name_ln;
            *(int *)&(pvVar2->
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&(pvVar2->
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        StmtBlock::add_stmt((StmtBlock *)
                            states.
                            super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (shared_ptr<kratos::Stmt> *)&stack0xffffffffffffffa8);
        if (fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
                     super__Vector_impl_data._M_start);
        }
        if (this->generator_->debug == true) {
          _uStack_58 = "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/fsm.cc"
          ;
          fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(fsms.
                                 super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0xca);
          std::
          vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
          ::emplace_back<std::pair<char_const*,int>>
                    ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                      *)&(local_128->super_Stmt).super_IRNode.fn_name_ln,
                     (pair<const_char_*,_int> *)&stack0xffffffffffffffa8);
        }
        generate_state_transition
                  (this,this_00,current_state,next_state,
                   (unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_1a0);
        if (this->moore_ == true) {
          generate_output(this,this_00,current_state,
                          (unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_1a0);
        }
        get_all_child_fsm((vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_> *)
                          &stack0xffffffffffffffa8,this);
        for (_Var18._M_p = _uStack_58;
            (pointer)_Var18._M_p !=
            fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
            super__Vector_impl_data._M_start;
            _Var18._M_p = (pointer)&(((IfStmt *)_Var18._M_p)->super_Stmt).super_IRNode.fn_name_ln) {
          *(undefined1 *)((((IfStmt *)_Var18._M_p)->super_Stmt).super_IRNode._vptr_IRNode + 0x28) =
               1;
        }
        this->realized_ = true;
        if ((IfStmt *)_uStack_58 != (IfStmt *)0x0) {
          operator_delete(_uStack_58,
                          (long)fsms.
                                super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)_uStack_58);
        }
        if (seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        if (predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        if (seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
        }
        if (local_100 != (undefined1  [8])&next_state_name._M_string_length) {
          operator_delete((void *)local_100,next_state_name._M_string_length + 1);
        }
        if (auStack_c8 != (undefined1  [8])&current_state_name._M_string_length) {
          operator_delete((void *)auStack_c8,current_state_name._M_string_length + 1);
        }
        std::
        _Hashtable<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)local_1a0);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                     *)local_1e0);
        if (state_name_mapping._M_h._M_single_bucket == (__node_base_ptr)0x0) {
          return;
        }
        operator_delete(state_name_mapping._M_h._M_single_bucket,
                        (long)states.
                              super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)state_name_mapping._M_h._M_single_bucket);
        return;
      }
      plVar13 = (long *)*plVar13;
    } while ((plVar13 != (long *)0x0) &&
            (peVar8 = (element_type *)plVar13[1],
            (ulong)peVar8 % (ulong)state_name_mapping._M_h._M_buckets == uVar19));
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void FSM::realize() {
    // never realize again
    if (realized_) return;
    // generate the statements to the generator
    // first, get state and next state variable
    // compute number of states
    auto states = get_all_child_states(false);
    uint64_t num_states = states.size();
    if (!num_states) throw UserException(::format("FSM {0} is empty", fsm_name()));
    uint32_t width = std::max<uint32_t>(1u, std::ceil(std::log2(num_states)));
    // define a enum type
    std::map<std::string, uint64_t> raw_def;
    uint64_t count = 0;
    if (!start_state_)
        throw UserException(::format("FSM {0} doesn't have a start state", fsm_name_));
    // name mapping
    std::unordered_map<FSMState*, std::string> state_name_mapping;
    bool has_child_state = !child_fsms_.empty();
    for (auto const& state : states) {
        // notice that we need to do an additional mapping if it's a nested fsm
        // to avoid any name conflicts
        std::string state_name;
        if (has_child_state) {
            state_name = state->parent()->fsm_name() + "_" + state->name();
        } else {
            state_name = state->name();
        }
        raw_def.emplace(state_name, count++);
        state_name_mapping.emplace(state, state_name);
        // check states
        state->check_outputs();
    }
    auto& enum_def = generator_->enum_(fsm_name_ + "_state", raw_def, width);
    // add debug info
    if (generator_->debug) {
        std::unordered_set<const FSM*> visited;
        for (auto const& state : states) {
            const auto* fsm = state->parent();
            if (visited.find(fsm) != visited.end()) continue;
            auto fn_ln = fsm->fn_name_ln_;
            for (auto const& [name, info] : fn_ln) {
                auto* s = fsm->get_state(name).get();
                if (state_name_mapping.find(state) == state_name_mapping.end()) {
                    throw UserException(::format(
                        "Unable to find state name {0} from FSM {1}. Is it a disconnected state?",
                        s->name(), fsm_name_));
                }
                auto state_name = state_name_mapping.at(state);
                enum_def.add_debug_info(state_name, info);
            }
        }
    }
    // create two state variable, current_state, and next_state
    auto current_state_name = generator_->get_unique_variable_name(fsm_name_, "current_state");
    auto next_state_name = generator_->get_unique_variable_name(fsm_name_, "next_state");
    auto& current_state = generator_->enum_var(current_state_name, enum_def.shared_from_this());
    current_state_ = &current_state;
    auto& next_state = generator_->enum_var(next_state_name, enum_def.shared_from_this());
    if (generator_->debug) {
        current_state.fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
        next_state.fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
    }

    // sequential logic
    // if (reset)
    //   current_state <= default_state
    // else
    //   current_state <= next_state
    auto seq = generator_->sequential();
    bool reset_high = true;
    seq->add_condition({EventEdgeType::Posedge, clk_});
    if (reset_->type() == VarType::PortIO &&
        ((reset_->as<Port>()->active_high() && !(*reset_->as<Port>()->active_high())) ||
         !reset_high_)) {
        seq->add_condition({EventEdgeType::Negedge, reset_});
        reset_high = false;
    } else {
        seq->add_condition({EventEdgeType::Posedge, reset_});
        reset_high = true;
    }
    if (generator_->debug) {
        seq->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
    }

    std::shared_ptr<Var> predicate;
    if (reset_high) {
        predicate = reset_;
    } else {
        predicate = (reset_->r_not()).as<Var>();
    }

    auto seq_if = std::make_shared<IfStmt>(predicate);
    {
        auto start_state_name = state_name_mapping.at(start_state_.get());
        auto stmt =
            current_state.assign(enum_def.get_enum(start_state_name), AssignmentType::NonBlocking);
        seq_if->add_then_stmt(stmt);
        if (generator_->debug) {
            if (!start_state_debug_.first.empty()) {
                stmt->fn_name_ln.emplace_back(start_state_debug_);
            }
            stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
        }
    }
    {
        auto stmt =
            current_state.assign(next_state.shared_from_this(), AssignmentType::NonBlocking);
        if (generator_->debug) stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
        seq_if->add_else_stmt(stmt);
    }
    // add it to the seq
    seq->add_stmt(seq_if);
    if (generator_->debug) seq_if->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));

    // combination logic to compute next state
    generate_state_transition(enum_def, current_state, next_state, state_name_mapping);

    // now the output logic
    // only generate output state block in moore machine. in mealy machine, the output
    // is fused inside the state transition.
    if (moore_) generate_output(enum_def, current_state, state_name_mapping);

    // set to realized for all states
    auto fsms = get_all_child_fsm();
    for (auto& fsm : fsms) fsm->realized_ = true;
    realized_ = true;
}